

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O0

void __thiscall QDockWidgetPrivate::setResizerActive(QDockWidgetPrivate *this,bool active)

{
  byte bVar1;
  bool bVar2;
  byte in_SIL;
  QDockWidgetPrivate *in_RDI;
  QWidgetResizeHandler *unaff_retaddr;
  QDockWidgetLayout *dwLayout;
  QDockWidget *q;
  QWidgetResizeHandler *in_stack_ffffffffffffffc8;
  undefined7 in_stack_fffffffffffffff0;
  QDockWidgetPrivate *parent;
  
  bVar1 = in_SIL & 1;
  parent = in_RDI;
  q_func(in_RDI);
  qobject_cast<QDockWidgetLayout*>((QObject *)0x58d5be);
  QDockWidget::isFloating((QDockWidget *)0x58d5d7);
  bVar2 = QDockWidgetLayout::nativeWindowDeco
                    ((QDockWidgetLayout *)in_RDI,SUB81((ulong)in_stack_ffffffffffffffc8 >> 0x38,0));
  if (!bVar2) {
    if (((bVar1 & 1) != 0) && (in_RDI->resizer == (QWidgetResizeHandler *)0x0)) {
      in_stack_ffffffffffffffc8 = (QWidgetResizeHandler *)operator_new(0x48);
      QWidgetResizeHandler::QWidgetResizeHandler
                (unaff_retaddr,(QWidget *)parent,
                 (QWidget *)CONCAT17(bVar1,in_stack_fffffffffffffff0));
      in_RDI->resizer = in_stack_ffffffffffffffc8;
    }
    if (in_RDI->resizer != (QWidgetResizeHandler *)0x0) {
      QWidgetResizeHandler::setEnabled
                ((QWidgetResizeHandler *)in_RDI,SUB81((ulong)in_stack_ffffffffffffffc8 >> 0x38,0));
    }
  }
  return;
}

Assistant:

void QDockWidgetPrivate::setResizerActive(bool active)
{
    Q_Q(QDockWidget);
    const auto *dwLayout = qobject_cast<QDockWidgetLayout *>(layout);
    if (dwLayout->nativeWindowDeco(q->isFloating()))
        return;

    if (active && !resizer)
        resizer = new QWidgetResizeHandler(q);
    if (resizer)
        resizer->setEnabled(active);
}